

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotefile.c
# Opt level: O2

apx_size_t rmf_address_decode(uint8_t *begin,uint8_t *end,uint32_t *address,_Bool *more_bit)

{
  byte bVar1;
  uint8_t u8Size;
  uint32_t uVar2;
  int iVar3;
  apx_size_t aVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(begin == (uint8_t *)0x0);
  auVar6._4_4_ = -(uint)(end == (uint8_t *)0x0);
  auVar6._8_4_ = -(uint)(address == (uint32_t *)0x0);
  auVar6._12_4_ = -(uint)(more_bit == (_Bool *)0x0);
  iVar3 = movmskps((int)address,auVar6);
  aVar4 = 0;
  if (iVar3 == 0 && begin < end) {
    bVar1 = *begin;
    *more_bit = (_Bool)(bVar1 >> 6 & 1);
    if ((char)bVar1 < '\0') {
      if (end < begin + 4) {
        return 0;
      }
      aVar4 = 4;
      uVar5 = 0x3fffffff;
      u8Size = '\x04';
    }
    else {
      if (end < begin + 2) {
        return 0;
      }
      aVar4 = 2;
      uVar5 = 0x3fff;
      u8Size = '\x02';
    }
    uVar2 = unpackBE(begin,u8Size);
    *address = uVar2 & uVar5;
  }
  return aVar4;
}

Assistant:

apx_size_t rmf_address_decode(uint8_t const* begin, uint8_t const* end, uint32_t* address, bool* more_bit)
{
   apx_size_t retval = 0u;
   if ((begin == NULL) || (end == NULL) || (address == NULL) || (more_bit == NULL) || (begin >= end))
   {
      return 0u; //Invalid argument
   }
   uint8_t const first_byte = *begin;
   *more_bit = (first_byte & RMF_U8_MORE_BIT) ? true : false;
   if (first_byte & RMF_U8_HIGH_ADDR_BIT)
   {
      if (begin +  UINT32_SIZE <= end)
      {
         uint32_t value = unpackBE(begin, (uint8_t) UINT32_SIZE);
         *address = value & RMF_HIGH_ADDR_MASK;
         retval = UINT32_SIZE;
      }
   }
   else
   {
      if (begin + UINT16_SIZE <= end)
      {
         uint32_t value = unpackBE(begin, UINT16_SIZE);
         *address = (value & RMF_LOW_ADDR_MASK);
         retval = UINT16_SIZE;
      }
   }
   return retval;
}